

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialer.c
# Opt level: O0

void dialer_register_stats(nni_dialer *d)

{
  uint32_t id;
  nni_dialer *d_local;
  
  nni_stat_set_id(&d->st_root,d->d_id);
  nni_stat_set_id(&d->st_id,d->d_id);
  id = nni_sock_id(d->d_sock);
  nni_stat_set_id(&d->st_sock,id);
  nni_stat_register(&d->st_root);
  return;
}

Assistant:

static void
dialer_register_stats(nni_dialer *d)
{
#ifdef NNG_ENABLE_STATS
	nni_stat_set_id(&d->st_root, (int) d->d_id);
	nni_stat_set_id(&d->st_id, (int) d->d_id);
	nni_stat_set_id(&d->st_sock, (int) nni_sock_id(d->d_sock));
	nni_stat_register(&d->st_root);
#else
	NNI_ARG_UNUSED(d);
#endif
}